

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::StripRight(FString *this)

{
  uint uVar1;
  char *__src;
  long lVar2;
  int iVar3;
  FStringData *pFVar4;
  long lVar5;
  size_t strlen;
  ulong uVar6;
  FStringData *old;
  
  __src = this->Chars;
  uVar1 = *(uint *)(__src + -0xc);
  uVar6 = (ulong)uVar1;
  if (uVar6 != 0) {
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      if (lVar5 + uVar6 == 1) break;
      iVar3 = isspace((uint)(byte)__src[lVar5 + (uVar6 - 2)]);
      lVar2 = lVar5 + -1;
    } while (iVar3 != 0);
    if (lVar5 != 1) {
      strlen = lVar5 + -1 + uVar6;
      if (*(int *)(__src + -4) < 2) {
        __src[lVar5 + (uVar6 - 1)] = '\0';
        ReallocBuffer(this,strlen);
        return;
      }
      pFVar4 = FStringData::Alloc(strlen);
      this->Chars = (char *)(pFVar4 + 1);
      pFVar4->Len = (uVar1 - 1) + (int)lVar5;
      memcpy(pFVar4 + 1,__src,strlen);
      *(undefined1 *)((long)&pFVar4->RefCount + lVar5 + uVar6 + 3) = 0;
      FStringData::Release((FStringData *)(__src + -0xc));
      return;
    }
  }
  return;
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}